

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export_ostream.hpp
# Opt level: O0

ostream_base * __thiscall
pstore::exchange::export_ns::ostream_base::write<long_long,void,void>(ostream_base *this,longlong v)

{
  longlong lVar1;
  size_t in_RCX;
  void *in_RDX;
  longlong v_local;
  ostream_base *this_local;
  
  if (v < 0) {
    write(this,0x2d,in_RDX,in_RCX);
    lVar1 = std::numeric_limits<long_long>::min();
    if (v == lVar1) {
      this_local = write<unsigned_long_long,void>(this,v);
    }
    else {
      this_local = write<unsigned_long_long,void>(this,-v);
    }
  }
  else {
    this_local = write<unsigned_long_long,void>(this,v);
  }
  return this_local;
}

Assistant:

ostream_base & write (Signed const v) {
                    using unsigned_type = typename std::make_unsigned<Signed>::type;
                    if (v < 0) {
                        this->write ('-');
                        if (v == std::numeric_limits<Signed>::min ()) {
                            return this->write (static_cast<unsigned_type> (v));
                        }
                        return this->write (static_cast<unsigned_type> (-v));
                    }
                    return this->write (static_cast<unsigned_type> (v));
                }